

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

void __thiscall QDirListing::QDirListing(QDirListing *this,QString *path,IteratorFlags flags)

{
  QDirListingPrivate *this_00;
  long in_FS_OFFSET;
  QFileSystemEntry local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDirListingPrivate *)operator_new(0x800);
  QDirListingPrivate::QDirListingPrivate(this_00);
  this->d = this_00;
  QFileSystemEntry::QFileSystemEntry(&local_60,path);
  QFileSystemEntry::operator=(&(this->d->initialEntryInfo).entry,&local_60);
  QFileSystemEntry::~QFileSystemEntry(&local_60);
  (this->d->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
  super_QFlagsStorage<QDirListing::IteratorFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
            super_QFlagsStorage<QDirListing::IteratorFlag>.i;
  QDirListingPrivate::init(this->d,(EVP_PKEY_CTX *)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirListing::QDirListing(const QString &path, IteratorFlags flags)
    : d(new QDirListingPrivate)
{
    d->initialEntryInfo.entry = QFileSystemEntry(path);
    d->iteratorFlags = flags;
    d->init();
}